

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O0

void TTD::NSSnapValues::InflateScriptContext
               (SnapContext *snpCtx,ScriptContext *intoCtx,InflateMap *inflator,
               TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::TopLevelScriptLoadFunctionBodyResolveInfo_*>
               *topLevelLoadScriptMap,
               TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::TopLevelNewFunctionBodyResolveInfo_*>
               *topLevelNewScriptMap,
               TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::TopLevelEvalFunctionBodyResolveInfo_*>
               *topLevelEvalScriptMap)

{
  char16_t *string1;
  TopLevelScriptLoadFunctionBodyResolveInfo *fbInfo_00;
  TopLevelNewFunctionBodyResolveInfo *fbInfo_01;
  TopLevelEvalFunctionBodyResolveInfo *fbInfo_02;
  bool bVar1;
  int iVar2;
  char16 *string2;
  JavascriptLibrary *pJVar3;
  TopLevelFunctionInContextRelation *pTVar4;
  TopLevelScriptLoadFunctionBodyResolveInfo **ppTVar5;
  ThreadContext *pTVar6;
  TopLevelNewFunctionBodyResolveInfo **ppTVar7;
  TopLevelEvalFunctionBodyResolveInfo **ppTVar8;
  void *unaff_retaddr;
  TopLevelEvalFunctionBodyResolveInfo *fbInfo_2;
  FunctionBody *fb_2;
  TopLevelFunctionInContextRelation *cri_2;
  uint32 i_2;
  TopLevelNewFunctionBodyResolveInfo *fbInfo_1;
  FunctionBody *fb_1;
  TopLevelFunctionInContextRelation *cri_1;
  uint32 i_1;
  undefined1 local_c0 [8];
  EnterScriptObject __enterScriptObject;
  ScriptEntryExitRecord __entryExitRecord;
  ScriptContext *__localScriptContext;
  TopLevelScriptLoadFunctionBodyResolveInfo *fbInfo;
  FunctionBody *fb;
  TopLevelFunctionInContextRelation *cri;
  uint32 i;
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::TopLevelEvalFunctionBodyResolveInfo_*>
  *topLevelEvalScriptMap_local;
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::TopLevelNewFunctionBodyResolveInfo_*>
  *topLevelNewScriptMap_local;
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::TopLevelScriptLoadFunctionBodyResolveInfo_*>
  *topLevelLoadScriptMap_local;
  InflateMap *inflator_local;
  ScriptContext *intoCtx_local;
  SnapContext *snpCtx_local;
  
  string1 = (snpCtx->ContextSRC).Contents;
  string2 = Js::ScriptContext::GetUrl(intoCtx);
  iVar2 = PAL_wcscmp(string1,string2);
  if (iVar2 == 0) {
    pJVar3 = Js::ScriptContext::GetLibrary(intoCtx);
    Js::JavascriptLibrary::SetIsPRNGSeeded(pJVar3,(bool)(snpCtx->IsPNRGSeeded & 1));
    pJVar3 = Js::ScriptContext::GetLibrary(intoCtx);
    Js::JavascriptLibrary::SetRandSeed0(pJVar3,snpCtx->RandomSeed0);
    pJVar3 = Js::ScriptContext::GetLibrary(intoCtx);
    Js::JavascriptLibrary::SetRandSeed1(pJVar3,snpCtx->RandomSeed1);
    InflateMap::AddScriptContext(inflator,snpCtx->ScriptContextLogId,intoCtx);
    ScriptContextTTD::ClearLoadedSourcesForSnapshotRestore(intoCtx->TTDContextInfo);
    bVar1 = Js::ScriptContext::HasRecordedException(intoCtx);
    if (bVar1) {
      Js::ScriptContext::GetAndClearRecordedException(intoCtx,(bool *)0x0);
    }
    for (cri._4_4_ = 0; cri._4_4_ < snpCtx->LoadedTopLevelScriptCount; cri._4_4_ = cri._4_4_ + 1) {
      pTVar4 = snpCtx->LoadedTopLevelScriptArray + cri._4_4_;
      fbInfo = (TopLevelScriptLoadFunctionBodyResolveInfo *)
               InflateMap::FindReusableFunctionBodyIfExists
                         (inflator,pTVar4->ContextSpecificBodyPtrId);
      ppTVar5 = TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::TopLevelScriptLoadFunctionBodyResolveInfo_*>
                ::LookupKnownItem(topLevelLoadScriptMap,(ulong)pTVar4->TopLevelBodyCtr);
      fbInfo_00 = *ppTVar5;
      if ((FunctionBody *)fbInfo == (FunctionBody *)0x0) {
        fbInfo = (TopLevelScriptLoadFunctionBodyResolveInfo *)
                 InflateTopLevelLoadedFunctionBodyInfo(fbInfo_00,intoCtx);
      }
      else {
        ScriptContextTTD::ProcessFunctionBodyOnLoad
                  (intoCtx->TTDContextInfo,(FunctionBody *)fbInfo,(FunctionBody *)0x0);
        ScriptContextTTD::RegisterLoadedScript
                  (intoCtx->TTDContextInfo,(FunctionBody *)fbInfo,pTVar4->TopLevelBodyCtr);
        pTVar6 = Js::ScriptContext::GetThreadContext(intoCtx);
        ExecutionInfoManager::ProcessScriptLoad_InflateReuseBody
                  (pTVar6->TTDExecutionInfo,pTVar4->TopLevelBodyCtr,(FunctionBody *)fbInfo);
      }
      InflateMap::UpdateFBScopes
                (inflator,&(fbInfo_00->TopLevelBase).ScopeChainInfo,(FunctionBody *)fbInfo);
      InflateMap::AddInflationFunctionBody
                (inflator,pTVar4->ContextSpecificBodyPtrId,(FunctionBody *)fbInfo);
    }
    __enterScriptObject.library = (JavascriptLibrary *)0x0;
    Js::EnterScriptObject::EnterScriptObject
              ((EnterScriptObject *)local_c0,intoCtx,
               (ScriptEntryExitRecord *)&__enterScriptObject.library,unaff_retaddr,&stack0x00000000,
               true,true,true);
    Js::ScriptContext::OnScriptStart(intoCtx,true,true);
    Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_c0);
    for (cri_1._0_4_ = 0; (uint)cri_1 < snpCtx->NewFunctionTopLevelScriptCount;
        cri_1._0_4_ = (uint)cri_1 + 1) {
      pTVar4 = snpCtx->NewFunctionTopLevelScriptArray + (uint)cri_1;
      fbInfo_1 = (TopLevelNewFunctionBodyResolveInfo *)
                 InflateMap::FindReusableFunctionBodyIfExists
                           (inflator,pTVar4->ContextSpecificBodyPtrId);
      ppTVar7 = TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::TopLevelNewFunctionBodyResolveInfo_*>
                ::LookupKnownItem(topLevelNewScriptMap,(ulong)pTVar4->TopLevelBodyCtr);
      fbInfo_01 = *ppTVar7;
      if ((FunctionBody *)fbInfo_1 == (FunctionBody *)0x0) {
        fbInfo_1 = (TopLevelNewFunctionBodyResolveInfo *)
                   InflateTopLevelNewFunctionBodyInfo(fbInfo_01,intoCtx);
      }
      else {
        ScriptContextTTD::ProcessFunctionBodyOnLoad
                  (intoCtx->TTDContextInfo,(FunctionBody *)fbInfo_1,(FunctionBody *)0x0);
        ScriptContextTTD::RegisterNewScript
                  (intoCtx->TTDContextInfo,(FunctionBody *)fbInfo_1,pTVar4->TopLevelBodyCtr);
        pTVar6 = Js::ScriptContext::GetThreadContext(intoCtx);
        ExecutionInfoManager::ProcessScriptLoad_InflateReuseBody
                  (pTVar6->TTDExecutionInfo,pTVar4->TopLevelBodyCtr,(FunctionBody *)fbInfo_1);
      }
      InflateMap::UpdateFBScopes
                (inflator,&(fbInfo_01->TopLevelBase).ScopeChainInfo,(FunctionBody *)fbInfo_1);
      InflateMap::AddInflationFunctionBody
                (inflator,pTVar4->ContextSpecificBodyPtrId,(FunctionBody *)fbInfo_1);
    }
    for (cri_2._4_4_ = 0; cri_2._4_4_ < snpCtx->EvalTopLevelScriptCount;
        cri_2._4_4_ = cri_2._4_4_ + 1) {
      pTVar4 = snpCtx->EvalTopLevelScriptArray + cri_2._4_4_;
      fbInfo_2 = (TopLevelEvalFunctionBodyResolveInfo *)
                 InflateMap::FindReusableFunctionBodyIfExists
                           (inflator,pTVar4->ContextSpecificBodyPtrId);
      ppTVar8 = TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::TopLevelEvalFunctionBodyResolveInfo_*>
                ::LookupKnownItem(topLevelEvalScriptMap,(ulong)pTVar4->TopLevelBodyCtr);
      fbInfo_02 = *ppTVar8;
      if ((FunctionBody *)fbInfo_2 == (FunctionBody *)0x0) {
        fbInfo_2 = (TopLevelEvalFunctionBodyResolveInfo *)
                   InflateTopLevelEvalFunctionBodyInfo(fbInfo_02,intoCtx);
      }
      else {
        ScriptContextTTD::ProcessFunctionBodyOnLoad
                  (intoCtx->TTDContextInfo,(FunctionBody *)fbInfo_2,(FunctionBody *)0x0);
        ScriptContextTTD::RegisterEvalScript
                  (intoCtx->TTDContextInfo,(FunctionBody *)fbInfo_2,pTVar4->TopLevelBodyCtr);
        pTVar6 = Js::ScriptContext::GetThreadContext(intoCtx);
        ExecutionInfoManager::ProcessScriptLoad_InflateReuseBody
                  (pTVar6->TTDExecutionInfo,pTVar4->TopLevelBodyCtr,(FunctionBody *)fbInfo_2);
      }
      InflateMap::UpdateFBScopes
                (inflator,&(fbInfo_02->TopLevelBase).ScopeChainInfo,(FunctionBody *)fbInfo_2);
      InflateMap::AddInflationFunctionBody
                (inflator,pTVar4->ContextSpecificBodyPtrId,(FunctionBody *)fbInfo_2);
    }
    Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_c0);
    return;
  }
  TTDAbort_unrecoverable_error("Make sure the src uri values are the same.");
}

Assistant:

void InflateScriptContext(const SnapContext* snpCtx, Js::ScriptContext* intoCtx, InflateMap* inflator,
            const TTDIdentifierDictionary<uint64, TopLevelScriptLoadFunctionBodyResolveInfo*>& topLevelLoadScriptMap,
            const TTDIdentifierDictionary<uint64, TopLevelNewFunctionBodyResolveInfo*>& topLevelNewScriptMap,
            const TTDIdentifierDictionary<uint64, TopLevelEvalFunctionBodyResolveInfo*>& topLevelEvalScriptMap)
        {
            TTDAssert(wcscmp(snpCtx->ContextSRC.Contents, intoCtx->GetUrl()) == 0, "Make sure the src uri values are the same.");

            intoCtx->GetLibrary()->SetIsPRNGSeeded(snpCtx->IsPNRGSeeded);
            intoCtx->GetLibrary()->SetRandSeed0(snpCtx->RandomSeed0);
            intoCtx->GetLibrary()->SetRandSeed1(snpCtx->RandomSeed1);
            inflator->AddScriptContext(snpCtx->ScriptContextLogId, intoCtx);

            intoCtx->TTDContextInfo->ClearLoadedSourcesForSnapshotRestore();

            if(intoCtx->HasRecordedException())
            {
                intoCtx->GetAndClearRecordedException(nullptr);
            }

            for(uint32 i = 0; i < snpCtx->LoadedTopLevelScriptCount; ++i)
            {
                const TopLevelFunctionInContextRelation& cri = snpCtx->LoadedTopLevelScriptArray[i];

                Js::FunctionBody* fb = inflator->FindReusableFunctionBodyIfExists(cri.ContextSpecificBodyPtrId);
                const TopLevelScriptLoadFunctionBodyResolveInfo* fbInfo = topLevelLoadScriptMap.LookupKnownItem(cri.TopLevelBodyCtr);

                if(fb == nullptr)
                {
                    fb = NSSnapValues::InflateTopLevelLoadedFunctionBodyInfo(fbInfo, intoCtx);
                }
                else
                {
                    intoCtx->TTDContextInfo->ProcessFunctionBodyOnLoad(fb, nullptr);
                    intoCtx->TTDContextInfo->RegisterLoadedScript(fb, cri.TopLevelBodyCtr);

                    intoCtx->GetThreadContext()->TTDExecutionInfo->ProcessScriptLoad_InflateReuseBody(cri.TopLevelBodyCtr, fb);
                }

                inflator->UpdateFBScopes(fbInfo->TopLevelBase.ScopeChainInfo, fb);
                inflator->AddInflationFunctionBody(cri.ContextSpecificBodyPtrId, fb);
            }

            //The inflation code for NewFunction and Eval uses the paths in the runtime (which assume they are in script) -- so enter here to make them happy
            BEGIN_ENTER_SCRIPT(intoCtx, true, true, true)
            {
                for(uint32 i = 0; i < snpCtx->NewFunctionTopLevelScriptCount; ++i)
                {
                    const TopLevelFunctionInContextRelation& cri = snpCtx->NewFunctionTopLevelScriptArray[i];

                    Js::FunctionBody* fb = inflator->FindReusableFunctionBodyIfExists(cri.ContextSpecificBodyPtrId);
                    const TopLevelNewFunctionBodyResolveInfo* fbInfo = topLevelNewScriptMap.LookupKnownItem(cri.TopLevelBodyCtr);

                    if(fb == nullptr)
                    {
                        fb = NSSnapValues::InflateTopLevelNewFunctionBodyInfo(fbInfo, intoCtx);
                    }
                    else
                    {
                        intoCtx->TTDContextInfo->ProcessFunctionBodyOnLoad(fb, nullptr);
                        intoCtx->TTDContextInfo->RegisterNewScript(fb, cri.TopLevelBodyCtr);

                        intoCtx->GetThreadContext()->TTDExecutionInfo->ProcessScriptLoad_InflateReuseBody(cri.TopLevelBodyCtr, fb);
                    }

                    inflator->UpdateFBScopes(fbInfo->TopLevelBase.ScopeChainInfo, fb);
                    inflator->AddInflationFunctionBody(cri.ContextSpecificBodyPtrId, fb);
                }

                for(uint32 i = 0; i < snpCtx->EvalTopLevelScriptCount; ++i)
                {
                    const TopLevelFunctionInContextRelation& cri = snpCtx->EvalTopLevelScriptArray[i];

                    Js::FunctionBody* fb = inflator->FindReusableFunctionBodyIfExists(cri.ContextSpecificBodyPtrId);
                    const TopLevelEvalFunctionBodyResolveInfo* fbInfo = topLevelEvalScriptMap.LookupKnownItem(cri.TopLevelBodyCtr);

                    if(fb == nullptr)
                    {
                        fb = NSSnapValues::InflateTopLevelEvalFunctionBodyInfo(fbInfo, intoCtx);
                    }
                    else
                    {
                        intoCtx->TTDContextInfo->ProcessFunctionBodyOnLoad(fb, nullptr);
                        intoCtx->TTDContextInfo->RegisterEvalScript(fb, cri.TopLevelBodyCtr);

                        intoCtx->GetThreadContext()->TTDExecutionInfo->ProcessScriptLoad_InflateReuseBody(cri.TopLevelBodyCtr, fb);
                    }

                    inflator->UpdateFBScopes(fbInfo->TopLevelBase.ScopeChainInfo, fb);
                    inflator->AddInflationFunctionBody(cri.ContextSpecificBodyPtrId, fb);
                }
            }
            END_ENTER_SCRIPT
        }